

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O3

int32_t __thiscall
aeron::concurrent::logbuffer::ExclusiveTermAppender::appendFragmentedMessage
          (ExclusiveTermAppender *this,int32_t termId,int32_t termOffset,HeaderWriter *header,
          AtomicBuffer *srcBuffer,index_t srcOffset,index_t length,index_t maxPayloadLength,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  uint8_t *puVar1;
  length_t lVar2;
  AtomicBuffer *pAVar3;
  uint8_t *puVar4;
  AtomicBuffer *pAVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  index_t iVar10;
  int32_t paddingLength;
  int iVar11;
  size_t length_00;
  undefined4 in_register_00000034;
  uint uVar12;
  int32_t iVar13;
  int index;
  int local_70 [2];
  index_t local_68;
  int local_64;
  uint local_60;
  int local_5c;
  long local_58;
  HeaderWriter *local_50;
  ExclusiveTermAppender *local_48;
  ulong local_40;
  AtomicBuffer *local_38;
  
  local_58 = CONCAT44(in_register_00000034,termId);
  uVar12 = 0;
  if (0 < length % maxPayloadLength) {
    uVar12 = length % maxPayloadLength + 0x3fU & 0xffffffe0;
  }
  lVar2 = this->m_termBuffer->m_length;
  uVar12 = uVar12 + termOffset + (maxPayloadLength + 0x20) * (length / maxPayloadLength);
  local_40 = (ulong)uVar12;
  *this->m_tailAddr = (local_58 << 0x20) + local_40;
  local_68 = srcOffset;
  local_50 = header;
  local_38 = srcBuffer;
  if ((int)lVar2 < (int)uVar12) {
    iVar13 = -2;
    iVar11 = lVar2 - termOffset;
    if (iVar11 != 0 && termOffset <= (int)lVar2) {
      pAVar3 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
      *(int *)(pAVar3->m_buffer + termOffset) = -iVar11;
      local_70[0] = 0;
      local_70[1] = 0;
      puVar4 = pAVar3->m_buffer;
      puVar1 = puVar4 + (long)termOffset + 4;
      puVar1[0] = '\0';
      puVar1[1] = 0xc0;
      puVar1[2] = '\x01';
      puVar1[3] = '\0';
      *(int32_t *)(puVar4 + (long)termOffset + 8) = termOffset;
      *(HeaderWriter *)(puVar4 + (long)termOffset + 0xc) = *local_50;
      *(int *)(puVar4 + (long)termOffset + 0x14) = (int)local_58;
      AtomicBuffer::boundsCheck(pAVar3,termOffset + 6,2);
      puVar1 = pAVar3->m_buffer;
      (puVar1 + (long)termOffset + 6)[0] = '\0';
      (puVar1 + (long)termOffset + 6)[1] = '\0';
      AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
      *(int *)(pAVar3->m_buffer + termOffset) = iVar11;
    }
  }
  else {
    bVar6 = 0x80;
    iVar10 = length;
    local_48 = this;
    do {
      iVar11 = maxPayloadLength;
      if (iVar10 < maxPayloadLength) {
        iVar11 = iVar10;
      }
      bVar7 = bVar6 | 0x40;
      if (maxPayloadLength < iVar10) {
        bVar7 = bVar6;
      }
      local_60 = (uint)bVar7;
      iVar8 = iVar11 + 0x20;
      pAVar3 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
      *(int *)(pAVar3->m_buffer + termOffset) = -0x20 - iVar11;
      local_70[0] = 0;
      local_70[1] = 0;
      puVar4 = pAVar3->m_buffer;
      puVar1 = puVar4 + (long)termOffset + 4;
      puVar1[0] = '\0';
      puVar1[1] = 0xc0;
      puVar1[2] = '\x01';
      puVar1[3] = '\0';
      *(int32_t *)(puVar4 + (long)termOffset + 8) = termOffset;
      *(HeaderWriter *)(puVar4 + (long)termOffset + 0xc) = *local_50;
      *(int *)(puVar4 + (long)termOffset + 0x14) = (int)local_58;
      pAVar3 = local_48->m_termBuffer;
      length_00 = (size_t)iVar11;
      index = (length - iVar10) + local_68;
      local_64 = iVar10;
      AtomicBuffer::boundsCheck(pAVar3,termOffset + 0x20,length_00);
      pAVar5 = local_38;
      AtomicBuffer::boundsCheck(local_38,index,length_00);
      this = local_48;
      memcpy(pAVar3->m_buffer + (long)termOffset + 0x20,pAVar5->m_buffer + index,length_00);
      pAVar3 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar3,termOffset + 5,1);
      pAVar3->m_buffer[(long)termOffset + 5] = (uint8_t)local_60;
      local_70[0] = termOffset;
      local_5c = iVar8;
      if ((reservedValueSupplier->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      lVar9 = (*reservedValueSupplier->_M_invoker)
                        ((_Any_data *)reservedValueSupplier,this->m_termBuffer,local_70,&local_5c);
      pAVar3 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar3,termOffset + 0x18,8);
      *(long *)(pAVar3->m_buffer + (long)termOffset + 0x18) = lVar9;
      pAVar3 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
      *(int *)(pAVar3->m_buffer + termOffset) = iVar8;
      termOffset = (iVar11 + 0x3fU & 0xffffffe0) + termOffset;
      bVar6 = 0;
      iVar10 = local_64 - iVar11;
    } while (iVar10 != 0 && iVar11 <= local_64);
    iVar13 = (int32_t)local_40;
  }
  return iVar13;
}

Assistant:

std::int32_t appendFragmentedMessage(
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        util::index_t maxPayloadLength,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        const int numMaxPayloads = length / maxPayloadLength;
        const util::index_t remainingPayload = length % maxPayloadLength;
        const util::index_t lastFrameLength = (remainingPayload > 0) ?
            util::BitUtil::align(remainingPayload + DataFrameHeader::LENGTH, FrameDescriptor::FRAME_ALIGNMENT) : 0;
        const util::index_t requiredLength =
            (numMaxPayloads * (maxPayloadLength + DataFrameHeader::LENGTH)) + lastFrameLength;

        const std::int32_t termLength = m_termBuffer.capacity();

        std::int32_t resultingOffset = termOffset + requiredLength;
        putRawTailOrdered(termId, resultingOffset);

        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termId, termOffset, header, termLength);
        }
        else
        {
            std::uint8_t flags = FrameDescriptor::BEGIN_FRAG;
            util::index_t remaining = length;
            std::int32_t offset = static_cast<std::int32_t>(termOffset);

            do
            {
                const util::index_t bytesToWrite = std::min(remaining, maxPayloadLength);
                const util::index_t frameLength = bytesToWrite + DataFrameHeader::LENGTH;
                const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

                header.write(m_termBuffer, offset, frameLength, termId);
                m_termBuffer.putBytes(
                    offset + DataFrameHeader::LENGTH,
                    srcBuffer,
                    srcOffset + (length - remaining),
                    bytesToWrite);

                if (remaining <= maxPayloadLength)
                {
                    flags |= FrameDescriptor::END_FRAG;
                }

                FrameDescriptor::frameFlags(m_termBuffer, offset, flags);

                const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, offset, frameLength);
                m_termBuffer.putInt64(offset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

                FrameDescriptor::frameLengthOrdered(m_termBuffer, offset, frameLength);

                flags = 0;
                offset += alignedLength;
                remaining -= bytesToWrite;
            }
            while (remaining > 0);
        }

        return resultingOffset;
    }